

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.h
# Opt level: O2

string * __thiscall
hdc::Graph<int>::to_str_abi_cxx11_(string *__return_storage_ptr__,Graph<int> *this)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  _Base_ptr p_Var3;
  stringstream ss;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(local_1a8,"{\n");
  for (p_Var3 = (this->graph)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->graph)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    poVar1 = std::operator<<(local_1a8,"    ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,p_Var3[1]._M_color);
    std::operator<<(poVar1," -> {");
    for (p_Var2 = *(_Rb_tree_node_base **)(p_Var3 + 2);
        p_Var2 != (_Rb_tree_node_base *)&p_Var3[1]._M_left;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      poVar1 = (ostream *)std::ostream::operator<<(local_1a8,p_Var2[1]._M_color);
      std::operator<<(poVar1,", ");
    }
    std::operator<<(local_1a8,"}\n");
  }
  std::operator<<(local_1a8,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_str() {
            std::stringstream ss;
            typename std::map<T, std::set<T> >::iterator it1;
            typename std::set<T>::iterator it2;

            ss << "{\n";

            for (it1 = graph.begin(); it1 != graph.end(); ++it1) {
                 ss << "    " << it1->first << " -> {";

                 for (it2 = it1->second.begin(); it2 != it1->second.end(); ++it2) {
                     ss << *it2 << ", ";
                 }

                 ss << "}\n";
            }

            ss << "}\n";

            return ss.str();
        }